

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_property_int(nk_context *ctx,char *name,int min,int *val,int max,int step,
                    float inc_per_pixel)

{
  nk_property_variant local_88;
  undefined1 local_60 [8];
  nk_property_variant variant;
  float inc_per_pixel_local;
  int step_local;
  int max_local;
  int *val_local;
  int min_local;
  char *name_local;
  nk_context *ctx_local;
  
  variant.step._4_4_ = inc_per_pixel;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5ca0,
                  "void nk_property_int(struct nk_context *, const char *, int, int *, int, int, float)"
                 );
  }
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5ca1,
                  "void nk_property_int(struct nk_context *, const char *, int, int *, int, int, float)"
                 );
  }
  if (val == (int *)0x0) {
    __assert_fail("val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5ca2,
                  "void nk_property_int(struct nk_context *, const char *, int, int *, int, int, float)"
                 );
  }
  if ((((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) && (name != (char *)0x0))
     && (val != (int *)0x0)) {
    nk_property_variant_int(&local_88,*val,min,max,step);
    memcpy(local_60,&local_88,0x28);
    nk_property(ctx,name,(nk_property_variant *)local_60,(float)variant.step._4_4_,NK_FILTER_INT);
    *val = variant.kind;
  }
  return;
}

Assistant:

NK_API void
nk_property_int(struct nk_context *ctx, const char *name,
    int min, int *val, int max, int step, float inc_per_pixel)
{
    struct nk_property_variant variant;
    NK_ASSERT(ctx);
    NK_ASSERT(name);
    NK_ASSERT(val);

    if (!ctx || !ctx->current || !name || !val) return;
    variant = nk_property_variant_int(*val, min, max, step);
    nk_property(ctx, name, &variant, inc_per_pixel, NK_FILTER_INT);
    *val = variant.value.i;
}